

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_binder.cpp
# Opt level: O0

void duckdb::PropagateCollations
               (ClientContext *param_1,ScalarFunction *bound_function,
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               *children)

{
  bool bVar1;
  ulong uVar2;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *in_stack_00000018;
  LogicalType collation_type;
  string collation;
  LogicalType *in_stack_ffffffffffffff68;
  LogicalType *in_stack_ffffffffffffff70;
  LogicalType *this;
  LogicalType local_78 [2];
  string *in_stack_ffffffffffffffb8;
  string local_38 [56];
  
  bVar1 = RequiresCollationPropagation(in_stack_ffffffffffffff70);
  if (bVar1) {
    ExtractCollation_abi_cxx11_(in_stack_00000018);
    uVar2 = ::std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      this = local_78;
      ::std::__cxx11::string::string((string *)this,local_38);
      LogicalType::VARCHAR_COLLATION(in_stack_ffffffffffffffb8);
      ::std::__cxx11::string::~string((string *)local_78);
      LogicalType::operator=(this,in_stack_ffffffffffffff68);
      LogicalType::~LogicalType((LogicalType *)0x2714ea);
    }
    ::std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void PropagateCollations(ClientContext &, ScalarFunction &bound_function, vector<unique_ptr<Expression>> &children) {
	if (!RequiresCollationPropagation(bound_function.return_type)) {
		// we only need to propagate if the function returns a varchar
		return;
	}
	auto collation = ExtractCollation(children);
	if (collation.empty()) {
		// no collation to propagate
		return;
	}
	// propagate the collation to the return type
	auto collation_type = LogicalType::VARCHAR_COLLATION(std::move(collation));
	bound_function.return_type = std::move(collation_type);
}